

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O1

void dump_cur_dill_insn(dill_stream_conflict s)

{
  uint *puVar1;
  disassemble_info info;
  undefined1 local_20 [8];
  
  (*s->j->init_disassembly)(s,local_20);
  puVar1 = (uint *)s->p->cur_ip;
  printf("%p  - %x - ",puVar1,(ulong)*puVar1);
  (*s->j->print_insn)(s,local_20,puVar1);
  putchar(10);
  return;
}

Assistant:

extern void
dump_cur_dill_insn(dill_stream s)
{
    struct disassemble_info info;
    s->j->init_disassembly(s, &info);

    void* p = s->p->cur_ip;
    printf("%p  - %x - ", p, (unsigned)*(int*)p);
    (void)s->j->print_insn(s, &info, (void*)p);
    printf("\n");
}